

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcFurnishingElement::IfcFurnishingElement(IfcFurnishingElement *this)

{
  *(undefined ***)&(this->super_IfcElement).field_0x148 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0x150 = 0;
  *(char **)&this->field_0x158 = "IfcFurnishingElement";
  IfcElement::IfcElement(&this->super_IfcElement,&PTR_construction_vtable_24__007b2ef0);
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x7b2de8;
  *(undefined8 *)&(this->super_IfcElement).field_0x148 = 0x7b2ed8;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 = 0x7b2e10;
  (this->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x7b2e38;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0x7b2e60;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.field_0x100 = 0x7b2e88;
  *(undefined8 *)&(this->super_IfcElement).field_0x138 = 0x7b2eb0;
  return;
}

Assistant:

IfcFurnishingElement() : Object("IfcFurnishingElement") {}